

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Promise<void> __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::tailCall
          (MembraneCallContextHook *this,Own<capnp::RequestHook> *request)

{
  Disposer *pDVar1;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  
  pDVar1 = request[2].disposer;
  MembraneRequestHook::wrap
            ((MembraneRequestHook *)&stack0xffffffffffffffd8,in_RDX,
             (MembranePolicy *)request[3].disposer,(bool)(*(byte *)&request[3].ptr ^ 1));
  (*pDVar1->_vptr_Disposer[3])(this,pDVar1,&stack0xffffffffffffffd8);
  kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)&stack0xffffffffffffffd8);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    return inner->tailCall(MembraneRequestHook::wrap(kj::mv(request), *policy, !reverse));
  }